

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  ushort uVar1;
  uint16_t *puVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  _Bool _Var6;
  int32_t iVar7;
  char *pcVar8;
  ulong uVar9;
  bitset_container_t *pbVar10;
  ulong uVar11;
  run_container_t *container;
  array_container_t *container_00;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  ushort *buf_00;
  uint cap;
  bool bVar16;
  bool bVar17;
  char *local_48;
  
  *readbytes = 4;
  if (maxbytes < 4) {
    ra_portable_deserialize_cold_13();
    return false;
  }
  cap = *(uint *)buf;
  uVar14 = cap & 0xffff;
  if (cap == 0x303a || uVar14 == 0x303b) {
    if (uVar14 == 0x303b) {
      pcVar15 = buf + 4;
      cap = (cap >> 0x10) + 1;
    }
    else {
      *readbytes = 8;
      if (maxbytes < 8) {
        ra_portable_deserialize_cold_12();
        return false;
      }
      cap = *(uint *)(buf + 4);
      pcVar15 = buf + 8;
    }
    if ((int)cap < 0x10001) {
      if (uVar14 == 0x303b) {
        iVar12 = cap + 0xe;
        if (-1 < (int)(cap + 7)) {
          iVar12 = cap + 7;
        }
        uVar9 = *readbytes + (long)(iVar12 >> 3);
        *readbytes = uVar9;
        if (maxbytes < uVar9) {
          ra_portable_deserialize_cold_1();
          return false;
        }
        pcVar8 = pcVar15 + (iVar12 >> 3);
        local_48 = pcVar15;
      }
      else {
        local_48 = (char *)0x0;
        pcVar8 = pcVar15;
      }
      lVar5 = (long)(int)(cap * 2) * 2;
      uVar9 = *readbytes + lVar5;
      *readbytes = uVar9;
      if (maxbytes < uVar9) {
        ra_portable_deserialize_cold_11();
      }
      else {
        _Var6 = ra_init_with_capacity(answer,cap);
        if (_Var6) {
          uVar9 = (ulong)cap;
          if (0 < (int)cap) {
            puVar2 = answer->keys;
            uVar13 = 0;
            do {
              puVar2[uVar13] = *(uint16_t *)(pcVar8 + uVar13 * 4);
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
          }
          buf_00 = (ushort *)(pcVar8 + lVar5);
          if (3 < (int)cap || uVar14 != 0x303b) {
            uVar13 = *readbytes + (long)(int)(cap * 4);
            *readbytes = uVar13;
            if (maxbytes < uVar13) {
              ra_portable_deserialize_cold_10();
              return false;
            }
            buf_00 = (ushort *)((long)buf_00 + (long)(int)(cap * 4));
          }
          bVar17 = (int)cap < 1;
          if ((int)cap < 1) {
            return bVar17;
          }
          uVar13 = 0;
          do {
            uVar1 = *(ushort *)(pcVar8 + uVar13 * 4 + 2);
            bVar16 = 0xfff < uVar1;
            if (uVar14 == 0x303b) {
              bVar16 = (1 << ((byte)uVar13 & 7) & (uint)(byte)local_48[uVar13 >> 3 & 0x1fffffff]) ==
                       0;
              bVar4 = !bVar16;
              bVar16 = bVar16 && 0xfff < uVar1;
            }
            else {
              bVar4 = false;
            }
            iVar12 = uVar1 + 1;
            if (bVar16) {
              sVar3 = *readbytes;
              *readbytes = sVar3 + 0x2000;
              if (maxbytes < sVar3 + 0x2000) {
                ra_portable_deserialize_cold_9();
LAB_00119e2e:
                bVar16 = false;
              }
              else {
                pbVar10 = bitset_container_create();
                if (pbVar10 == (bitset_container_t *)0x0) {
                  ra_portable_deserialize_cold_8();
                  goto LAB_00119e2e;
                }
                answer->size = answer->size + 1;
                pbVar10->cardinality = iVar12;
                memcpy(pbVar10->words,buf_00,0x2000);
                buf_00 = buf_00 + 0x1000;
                answer->containers[uVar13] = pbVar10;
                answer->typecodes[uVar13] = '\x01';
                bVar16 = true;
              }
              if (bVar16) {
LAB_00119e0a:
                bVar16 = true;
              }
              else {
                bVar16 = false;
              }
            }
            else {
              if (!bVar4) {
                uVar11 = (ulong)(uint)(iVar12 * 2) + *readbytes;
                *readbytes = uVar11;
                if (maxbytes < uVar11) {
                  ra_portable_deserialize_cold_4();
                  goto LAB_00119eaf;
                }
                container_00 = array_container_create_given_capacity(iVar12);
                if (container_00 == (array_container_t *)0x0) {
                  ra_portable_deserialize_cold_3();
                }
                else {
                  answer->size = answer->size + 1;
                  iVar7 = array_container_read(iVar12,container_00,(char *)buf_00);
                  buf_00 = (ushort *)((long)buf_00 + (long)iVar7);
                  answer->containers[uVar13] = container_00;
                  answer->typecodes[uVar13] = '\x02';
                }
                bVar16 = container_00 != (array_container_t *)0x0;
LAB_00119e01:
                if (!bVar16) goto LAB_00119e49;
                goto LAB_00119e0a;
              }
              uVar11 = *readbytes + 2;
              *readbytes = uVar11;
              if (uVar11 <= maxbytes) {
                uVar11 = uVar11 + (ulong)*buf_00 * 4;
                *readbytes = uVar11;
                if (maxbytes < uVar11) {
                  ra_portable_deserialize_cold_6();
                }
                else {
                  iVar7 = 0x10;
                  container = (run_container_t *)malloc(0x10);
                  if (container == (run_container_t *)0x0) {
                    container = (run_container_t *)0x0;
                  }
                  else {
                    container->n_runs = 0;
                    container->capacity = 0;
                    container->runs = (rle16_t *)0x0;
                  }
                  if (container != (run_container_t *)0x0) {
                    answer->size = answer->size + 1;
                    iVar7 = run_container_read(iVar7,container,(char *)buf_00);
                    buf_00 = (ushort *)((long)buf_00 + (long)iVar7);
                    answer->containers[uVar13] = container;
                    answer->typecodes[uVar13] = '\x03';
                    bVar16 = true;
                    goto LAB_00119e01;
                  }
                  ra_portable_deserialize_cold_5();
                }
LAB_00119eaf:
                bVar16 = false;
                goto LAB_00119e01;
              }
              ra_portable_deserialize_cold_7();
LAB_00119e49:
              bVar16 = false;
            }
            if (!bVar16) {
              return bVar17;
            }
            uVar13 = uVar13 + 1;
            bVar17 = uVar9 <= uVar13;
            if (uVar13 == uVar9) {
              return bVar17;
            }
          } while( true );
        }
        ra_portable_deserialize_cold_2();
      }
      return false;
    }
    pcVar15 = "You cannot have so many containers, the data must be corrupted: %d\n";
  }
  else {
    pcVar15 = "I failed to find one of the right cookies. Found %u\n";
  }
  fprintf(_stderr,pcVar15,(ulong)cap);
  return false;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf, const size_t maxbytes, size_t * readbytes) {
    *readbytes = sizeof(int32_t);// for cookie
    if(*readbytes > maxbytes) {
      fprintf(stderr, "Ran out of bytes while reading first 4 bytes.\n");
      return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        fprintf(stderr, "I failed to find one of the right cookies. Found %" PRIu32 "\n",
                cookie);
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if(*readbytes > maxbytes) {
          fprintf(stderr, "Ran out of bytes while reading second part of the cookie.\n");
          return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1<<16)) {
       fprintf(stderr, "You cannot have so many containers, the data must be corrupted: %" PRId32 "\n",
                size);
       return false; // logically impossible
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if(*readbytes > maxbytes) {// data is corrupted?
          fprintf(stderr, "Ran out of bytes while reading run bitmap.\n");
          return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if(*readbytes > maxbytes) {
      fprintf(stderr, "Ran out of bytes while reading key-cardinality array.\n");
      return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        fprintf(stderr, "Failed to allocate memory for roaring array. Bailing out.\n");
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if(*readbytes > maxbytes) {// data is corrupted?
          fprintf(stderr, "Ran out of bytes while reading offsets.\n");
          ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
          return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k+1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if(hasrun) {
          if((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
            isbitmap = false;
            isrun = true;
          }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize = BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {
              fprintf(stderr, "Running out of bytes while reading a bitset container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for a bitset container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if(*readbytes > maxbytes) {
              fprintf(stderr, "Running out of bytes while reading a run container (header).\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {// data is corrupted?
              fprintf(stderr, "Running out of bytes while reading a run container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for a run container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {// data is corrupted?
              fprintf(stderr, "Running out of bytes while reading an array container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for an array container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}